

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSession.cpp
# Opt level: O2

void __thiscall ki::protocol::net::ServerSession::is_alive(ServerSession *this)

{
  is_alive((ServerSession *)((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-4])
          );
  return;
}

Assistant:

bool ServerSession::is_alive() const
	{
		// If the session isn't established yet, use the time of
		// creation to decide whether this session is alive.
		if (!m_established)
			return std::chrono::duration_cast<std::chrono::seconds>(
				std::chrono::steady_clock::now() - m_creation_time
			).count() <= (KI_CONNECTION_TIMEOUT * 2);

		// Otherwise, use the last time we received a heartbeat.
		return std::chrono::duration_cast<std::chrono::seconds>(
			std::chrono::steady_clock::now() - m_last_received_heartbeat_time
		).count() <= (KI_CLIENT_HEARTBEAT * 2);
	}